

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O1

_Bool effect_handler_SHORT_BEAM(effect_handler_context_t *context)

{
  wchar_t typ;
  anon_enum_32 aVar1;
  bool bVar2;
  _Bool _Var3;
  wchar_t dam;
  wchar_t wVar4;
  wchar_t wVar5;
  int iVar6;
  wchar_t wVar7;
  source origin;
  loc target;
  
  iVar6 = 0;
  dam = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  bVar2 = false;
  if ((context->origin).what == SRC_PLAYER) {
    bVar2 = L'\0' < context->other;
  }
  typ = context->subtype;
  wVar7 = context->radius;
  if (bVar2) {
    wVar4 = eff_level(player);
    iVar6 = wVar4 / context->other;
  }
  wVar7 = iVar6 + wVar7;
  target = (loc)loc(-1,-1);
  aVar1 = (context->origin).what;
  wVar4 = L'Ѱ';
  if (aVar1 == SRC_PLAYER) {
    if (context->dir == L'\x05') {
      _Var3 = target_okay();
      if (_Var3) {
        target_get((loc_conflict *)&target);
        goto LAB_0013a40a;
      }
    }
    target = (loc)loc_sum(player->grid,(loc_conflict)ddgrid[context->dir]);
  }
  else if (aVar1 == SRC_MONSTER) {
    target.x = (player->grid).x;
    target.y = (player->grid).y;
    wVar4 = L'౰';
  }
LAB_0013a40a:
  wVar5 = L'\x19';
  if (wVar7 < L'\x19') {
    wVar5 = wVar7;
  }
  origin._4_4_ = 0;
  origin.what = (context->origin).what;
  origin.which.trap = (context->origin).which.trap;
  _Var3 = project(origin,wVar7,target,dam,typ,wVar4,L'\0',(uint8_t)wVar5,context->obj);
  if (_Var3) {
    context->ident = true;
  }
  return true;
}

Assistant:

bool effect_handler_SHORT_BEAM(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, false);
	int type = context->subtype;
	bool add = (context->origin.what == SRC_PLAYER) && (context->other > 0);
	int rad = context->radius + (add ? eff_level(player) / context->other : 0);

	struct loc target = loc(-1, -1);

	/* Diameter of source is the same as the radius, so the effect is
	 * essentially full strength for its entire length. */
	int diameter_of_source = rad;

	int flg = PROJECT_ARC | PROJECT_GRID | PROJECT_ITEM | PROJECT_KILL;

	/* Player or monster? */
	if (context->origin.what == SRC_MONSTER) {
		flg |= PROJECT_PLAY;
		target = player->grid;
	} else if (context->origin.what == SRC_PLAYER) {
		/* Ask for a target if no direction given */
		if (context->dir == DIR_TARGET && target_okay()) {
			target_get(&target);
		} else {
			target = loc_sum(player->grid, ddgrid[context->dir]);
		}
	}

	/* Check bounds */
	if (diameter_of_source > 25) {
		diameter_of_source = 25;
	}

	/* Aim at the target */
	if (project(context->origin, rad, target, dam, type, flg, 0,
				diameter_of_source, context->obj)) {
		context->ident = true;
	}

	return true;
}